

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

complex<long_double> * __thiscall
TPZSkylMatrix<std::complex<long_double>_>::GetVal
          (TPZSkylMatrix<std::complex<long_double>_> *this,int64_t r,int64_t c)

{
  long lVar1;
  int64_t iVar2;
  complex<long_double> **ppcVar3;
  long in_RCX;
  complex<long_double> *pcVar4;
  long in_RDX;
  long in_RSI;
  complex<long_double> *in_RDI;
  int64_t index;
  int64_t index_1;
  int64_t col;
  int64_t row;
  int64_t in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffff92;
  complex<long_double> *pcVar5;
  long local_28;
  long local_20 [4];
  
  local_28 = in_RCX;
  if (in_RCX < in_RDX) {
    pcVar5 = in_RDI;
    local_20[0] = in_RDX;
    TPZMatrix<std::complex<long_double>_>::Swap(local_20,&local_28);
    lVar1 = local_28 - local_20[0];
    iVar2 = Size((TPZSkylMatrix<std::complex<long_double>_> *)
                 CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
    if (lVar1 < iVar2) {
      TPZVec<std::complex<long_double>_*>::operator[]
                ((TPZVec<std::complex<long_double>_*> *)(in_RSI + 0x20),local_28);
      std::conj<long_double>(pcVar5);
    }
    else {
      std::complex<long_double>::complex(pcVar5,(longdouble)0,(longdouble)0);
    }
  }
  else {
    pcVar5 = in_RDI;
    iVar2 = Size((TPZSkylMatrix<std::complex<long_double>_> *)
                 CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
    if (in_RCX - in_RDX < iVar2) {
      ppcVar3 = TPZVec<std::complex<long_double>_*>::operator[]
                          ((TPZVec<std::complex<long_double>_*> *)(in_RSI + 0x20),local_28);
      pcVar4 = *ppcVar3 + (in_RCX - in_RDX);
      *(undefined8 *)pcVar5->_M_value = *(undefined8 *)pcVar4->_M_value;
      *(undefined8 *)(pcVar5->_M_value + 8) = *(undefined8 *)(pcVar4->_M_value + 8);
      *(undefined8 *)(pcVar5->_M_value + 0x10) = *(undefined8 *)(pcVar4->_M_value + 0x10);
      *(undefined8 *)(pcVar5->_M_value + 0x18) = *(undefined8 *)(pcVar4->_M_value + 0x18);
    }
    else {
      std::complex<long_double>::complex(pcVar5,(longdouble)0,(longdouble)0);
    }
  }
  return in_RDI;
}

Assistant:

const TVar
TPZSkylMatrix<TVar>::GetVal(const int64_t r,const int64_t c ) const
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col ){
		this->Swap( &row, &col );
        const int64_t index   = col - row;
        if ( index < Size(col) ){
            if constexpr (is_complex<TVar>::value){
                return( std::conj(fElem[col][index]) );
            }else{
                return( fElem[col][index] );
            }
        }else{
            return (TVar)0;
        }
    }
	const int64_t index   = col - row;
	if ( index < Size(col) )
		return( fElem[col][index] );
	else {
		return (TVar) 0;
    }

}